

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTexture2LookupTestCase::verifyLookupTextureData
          (SparseTexture2LookupTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  undefined1 *this_00;
  pointer *__x;
  pointer pcVar1;
  GLint GVar2;
  _Alloc_hider _Var3;
  pointer puVar4;
  GLenum GVar5;
  GLenum GVar6;
  int iVar7;
  deUint32 err;
  ostream *poVar8;
  size_t sVar9;
  TestError *this_01;
  undefined4 in_register_0000000c;
  size_type __new_size;
  SparseTexture2LookupTestCase *this_02;
  long lVar10;
  int iVar11;
  bool bVar12;
  ulong uVar13;
  SparseTexture2LookupTestCase *pSVar14;
  ulong uVar15;
  GLint depth;
  GLenum local_6d4;
  GLuint verifyTexture;
  GLint height;
  GLint width;
  GLenum local_6c4;
  int local_6c0;
  GLint local_6bc;
  pointer local_6b8;
  SparseTexture2LookupTestCase *local_6b0;
  undefined8 local_6a8;
  int local_69c;
  string shader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  ShaderProgram program;
  FunctionToken f;
  ostringstream s_1;
  TokenStringsExt s;
  
  local_6a8 = CONCAT44(in_register_0000000c,format);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             field_0x88;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verify Lookup Texture Data [function: ",0x26);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,(funcToken->name)._M_dataplus._M_p,
                      (funcToken->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", level: ",9);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0xab0);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_6d4 = target;
  local_6bc = level;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  GVar2 = width;
  bVar12 = true;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      minDepth <= depth)) {
    if (local_6d4 == 0x8513) {
      depth = depth * 6;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __new_size = (size_type)(height * width * depth);
    local_6b0 = this;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
    puVar4 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_6b8 = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,__new_size);
    f.name._M_dataplus._M_p = (pointer)&f.name.field_2;
    pcVar1 = (funcToken->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f,pcVar1,pcVar1 + (funcToken->name)._M_string_length);
    f.arguments._M_dataplus._M_p = (pointer)&f.arguments.field_2;
    pcVar1 = (funcToken->arguments)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f.arguments,pcVar1,pcVar1 + (funcToken->arguments)._M_string_length);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&f.allowedTargets._M_t,&(funcToken->allowedTargets)._M_t);
    local_6c4 = 0x8c1a;
    if (local_6d4 == 0x9100) {
      local_6c4 = 0xde1;
    }
    gl4cts::Texture::Generate(gl,&verifyTexture);
    gl4cts::Texture::Bind(gl,verifyTexture,local_6c4);
    gl4cts::Texture::Storage(gl,local_6c4,1,0x8229,width,height,depth);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0xadc);
    if ((local_6b0->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
        mState.samples < 1) {
      bVar12 = true;
    }
    else {
      local_69c = GVar2 / 2;
      bVar12 = true;
      local_6c0 = 0;
      pSVar14 = local_6b0;
      do {
        memset(local_6b8,0,__new_size);
        GVar5 = local_6c4;
        gl4cts::Texture::Bind(gl,verifyTexture,local_6c4);
        gl4cts::Texture::SubImage(gl,GVar5,0,0,0,0,width,height,depth,0x1903,0x1401,local_6b8);
        GVar6 = (*gl->getError)();
        glu::checkError(GVar6,"Texture::SubImage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0xae5);
        this_02 = (SparseTexture2LookupTestCase *)st2_compute_lookupVerify;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&shader,st2_compute_lookupVerify,(allocator<char> *)&s);
        createLookupShaderTokens(&s,this_02,local_6d4,(GLint)local_6a8,local_6bc,local_6c0,&f);
        replaceToken("<FUNCTION>",f.name._M_dataplus._M_p,&shader);
        replaceToken("<ARGUMENTS>",f.arguments._M_dataplus._M_p,&shader);
        replaceToken("<OUTPUT_TYPE>",s.super_TokenStrings.outputType._M_dataplus._M_p,&shader);
        replaceToken("<INPUT_TYPE>",s.super_TokenStrings.inputType._M_dataplus._M_p,&shader);
        replaceToken("<SIZE_DEF>",s.sizeDef._M_dataplus._M_p,&shader);
        replaceToken("<LOD>",s.lod._M_dataplus._M_p,&shader);
        replaceToken("<LOD_DEF>",s.lodDef._M_dataplus._M_p,&shader);
        replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&shader);
        replaceToken("<ICOORD_TYPE>",s.iCoordType._M_dataplus._M_p,&shader);
        replaceToken("<COORD_DEF>",s.coordDef._M_dataplus._M_p,&shader);
        replaceToken("<POINT_TYPE>",s.super_TokenStrings.pointType._M_dataplus._M_p,&shader);
        replaceToken("<POINT_DEF>",s.super_TokenStrings.pointDef._M_dataplus._M_p,&shader);
        replaceToken("<RETURN_TYPE>",s.super_TokenStrings.returnType._M_dataplus._M_p,&shader);
        replaceToken("<RESULT_EXPECTED>",s.super_TokenStrings.resultExpected._M_dataplus._M_p,
                     &shader);
        replaceToken("<EPSILON>",s.super_TokenStrings.epsilon._M_dataplus._M_p,&shader);
        replaceToken("<SAMPLE_DEF>",s.super_TokenStrings.sampleDef._M_dataplus._M_p,&shader);
        replaceToken("<REFZ_DEF>",s.refZDef._M_dataplus._M_p,&shader);
        replaceToken("<POINT_COORD>",s.pointCoord._M_dataplus._M_p,&shader);
        replaceToken("<COMPONENT_DEF>",s.componentDef._M_dataplus._M_p,&shader);
        replaceToken("<CUBE_MAP_COORD_DEF>",s.cubeMapCoordDef._M_dataplus._M_p,&shader);
        replaceToken("<OFFSET_ARRAY_DEF>",s.offsetArrayDef._M_dataplus._M_p,&shader);
        replaceToken("<FORMAT_DEF>",s.formatDef._M_dataplus._M_p,&shader);
        replaceToken("<OFFSET_TYPE>",s.offsetType._M_dataplus._M_p,&shader);
        replaceToken("<NOFFSET_TYPE>",s.nOffsetType._M_dataplus._M_p,&shader);
        replaceToken("<OFFSET_DIM>",s.offsetDim._M_dataplus._M_p,&shader);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s_1);
        std::ostream::operator<<((ostringstream *)&s_1,width);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s_1);
        std::ios_base::~ios_base
                  ((ios_base *)&s_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        replaceToken("<TEX_WIDTH>",
                     (GLchar *)
                     CONCAT44(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start),&shader);
        if ((pointer *)
            CONCAT44(program.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (uint)program.m_shaders[0].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start) !=
            &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete((undefined1 *)
                          CONCAT44(program.m_shaders[0].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)program.m_shaders[0].
                                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                          (long)program.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s_1);
        std::ostream::operator<<((ostringstream *)&s_1,height);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s_1);
        std::ios_base::~ios_base
                  ((ios_base *)&s_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        replaceToken("<TEX_HEIGHT>",
                     (GLchar *)
                     CONCAT44(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start),&shader);
        if ((pointer *)
            CONCAT44(program.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (uint)program.m_shaders[0].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start) !=
            &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete((undefined1 *)
                          CONCAT44(program.m_shaders[0].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)program.m_shaders[0].
                                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                          (long)program.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s_1);
        std::ostream::operator<<((ostringstream *)&s_1,depth);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s_1);
        std::ios_base::~ios_base
                  ((ios_base *)&s_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        replaceToken("<TEX_DEPTH>",
                     (GLchar *)
                     CONCAT44(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start),&shader);
        if ((pointer *)
            CONCAT44(program.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (uint)program.m_shaders[0].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start) !=
            &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete((undefined1 *)
                          CONCAT44(program.m_shaders[0].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)program.m_shaders[0].
                                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                          (long)program.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        s_1.super_basic_ostream<char,_std::char_traits<char>_>._192_1_ = 0;
        s_1.super_basic_ostream<char,_std::char_traits<char>_>._193_8_ = 0;
        s_1.super_basic_ostream<char,_std::char_traits<char>_>._176_8_ = 0;
        s_1.super_basic_ostream<char,_std::char_traits<char>_>._184_1_ = 0;
        s_1.super_basic_ostream<char,_std::char_traits<char>_>._185_7_ = 0;
        memset((ostringstream *)&s_1,0,0xac);
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(program.m_shaders + 1);
        __x = &program.m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__x,shader._M_dataplus._M_p,
                   shader._M_dataplus._M_p + shader._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(&s_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                       + (ulong)(uint)program.m_shaders[0].
                                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start * 3),
                    (value_type *)__x);
        if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
            program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != program.m_shaders + 1) {
          operator_delete(program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,
                          (long)program.m_shaders[1].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
        }
        glu::ShaderProgram::ShaderProgram
                  (&program,((pSVar14->super_SparseTexture2CommitmentTestCase).
                             super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                            m_renderCtx,(ProgramSources *)&s_1);
        if (program.m_program.m_info.linkOk == true) {
          (*gl->useProgram)(program.m_program.m_program);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"glUseProgram",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb13);
          (*gl->bindImageTexture)(1,verifyTexture,0,'\x01',0,0x88b9,0x8232);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb1c);
          (*gl->uniform1i)(1,1);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb1e);
          iVar7 = std::__cxx11::string::compare((char *)&f);
          if (iVar7 == 0) {
            (*gl->bindImageTexture)(0,*texture,local_6bc,'\0',0,35000,(GLenum)local_6a8);
            GVar6 = (*gl->getError)();
            glu::checkError(GVar6,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb32);
            (*gl->uniform1i)(2,0);
            err = (*gl->getError)();
            iVar7 = 0xb34;
          }
          else {
            (*gl->activeTexture)(0x84c0);
            GVar6 = (*gl->getError)();
            glu::checkError(GVar6,"glActiveTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb24);
            (*gl->bindTexture)(local_6d4,*texture);
            GVar6 = (*gl->getError)();
            glu::checkError(GVar6,"glBindTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xb26);
            (*gl->uniform1i)(2,0);
            err = (*gl->getError)();
            iVar7 = 0xb28;
          }
          glu::checkError(err,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,iVar7);
          (*gl->uniform1i)(3,local_69c);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb39);
          (*gl->dispatchCompute)(width,height,depth);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb3b);
          (*gl->memoryBarrier)(0xffffffff);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"glMemoryBarrier",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb3d);
          gl4cts::Texture::Bind(gl,verifyTexture,GVar5);
          gl4cts::Texture::GetData(gl,0,GVar5,0x1903,0x1401,local_6b8);
          GVar5 = (*gl->getError)();
          glu::checkError(GVar5,"Texture::GetData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0xb41);
          if (0 < (long)depth) {
            iVar7 = 0;
            lVar10 = 0;
            do {
              if (0 < height) {
                iVar11 = 0;
                uVar15 = 0;
                do {
                  if (0 < width) {
                    uVar13 = 0;
                    do {
                      if (puVar4[uVar13 + (long)iVar11 + (long)iVar7] !=
                          local_6b8[uVar13 + (long)iVar11 + (long)iVar7]) {
                        bVar12 = false;
                      }
                      uVar13 = uVar13 + 1;
                    } while ((uint)width != uVar13);
                  }
                  uVar15 = uVar15 + 1;
                  iVar11 = iVar11 + width;
                } while (uVar15 != (uint)height);
              }
              lVar10 = lVar10 + 1;
              iVar7 = iVar7 + width * height;
            } while (lVar10 != depth);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Compute shader compilation failed (lookup) for target: ",
                     0x37);
          poVar8 = (ostream *)std::ostream::operator<<(this_00,local_6d4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", format: ",10);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_6a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", shaderInfoLog: ",0x11);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,((*program.m_shaders[5].
                                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                     _M_dataplus._M_p,
                              ((*program.m_shaders[5].
                                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                              _M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", programInfoLog: ",0x12);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,program.m_program.m_info.infoLog._M_dataplus._M_p,
                              program.m_program.m_info.infoLog._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", shaderSource: ",0x10);
          _Var3 = shader._M_dataplus;
          if (shader._M_dataplus._M_p == (pointer)0x0) {
            std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
          }
          else {
            sVar9 = strlen(shader._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,_Var3._M_p,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
          bVar12 = false;
        }
        glu::ShaderProgram::~ShaderProgram(&program);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&s_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                &s_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90);
        lVar10 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&s_1.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream + lVar10));
          lVar10 = lVar10 + -0x18;
        } while (lVar10 != -0x18);
        TokenStringsExt::~TokenStringsExt(&s);
        pSVar14 = local_6b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shader._M_dataplus._M_p != &shader.field_2) {
          operator_delete(shader._M_dataplus._M_p,shader.field_2._M_allocated_capacity + 1);
        }
        local_6c0 = local_6c0 + 1;
      } while (local_6c0 <
               (pSVar14->super_SparseTexture2CommitmentTestCase).
               super_SparseTextureCommitmentTestCase.mState.samples);
    }
    gl4cts::Texture::Delete(gl,&verifyTexture);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&f.allowedTargets._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.arguments._M_dataplus._M_p != &f.arguments.field_2) {
      operator_delete(f.arguments._M_dataplus._M_p,f.arguments.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.name._M_dataplus._M_p != &f.name.field_2) {
      operator_delete(f.name._M_dataplus._M_p,f.name.field_2._M_allocated_capacity + 1);
    }
    if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar12;
}

Assistant:

bool SparseTexture2LookupTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
														   GLuint& texture, GLint level, FunctionToken& funcToken)
{
	mLog << "Verify Lookup Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height * depth;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint verifyTarget;
	if (target == GL_TEXTURE_2D_MULTISAMPLE)
		verifyTarget = GL_TEXTURE_2D;
	else
		verifyTarget = GL_TEXTURE_2D_ARRAY;

	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	for (int sample = 0; sample < mState.samples; ++sample)
	{
		deMemset(out_data, 0, texSize);

		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
						  (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

		std::string shader = st2_compute_lookupVerify;

		// Adjust shader source to texture format
		TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

		replaceToken("<FUNCTION>", f.name.c_str(), shader);
		replaceToken("<ARGUMENTS>", f.arguments.c_str(), shader);

		replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
		replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
		replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), shader);
		replaceToken("<LOD>", s.lod.c_str(), shader);
		replaceToken("<LOD_DEF>", s.lodDef.c_str(), shader);
		replaceToken("<COORD_TYPE>", s.coordType.c_str(), shader);
		replaceToken("<ICOORD_TYPE>", s.iCoordType.c_str(), shader);
		replaceToken("<COORD_DEF>", s.coordDef.c_str(), shader);
		replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
		replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
		replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
		replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
		replaceToken("<EPSILON>", s.epsilon.c_str(), shader);
		replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
		replaceToken("<REFZ_DEF>", s.refZDef.c_str(), shader);
		replaceToken("<POINT_COORD>", s.pointCoord.c_str(), shader);
		replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), shader);
		replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), shader);
		replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), shader);
		replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), shader);
		replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), shader);
		replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), shader);
		replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), shader);

		replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), shader);
		replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), shader);
		replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), shader);

		ProgramSources sources;
		sources << ComputeSource(shader);

		// Build and run shader
		ShaderProgram program(m_context.getRenderContext(), sources);
		if (program.isOk())
		{
			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

			// Pass output image to shader
			gl.bindImageTexture(1, //unit
								verifyTexture,
								0,		 //level
								GL_TRUE, //layered
								0,		 //layer
								GL_WRITE_ONLY, GL_R8UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.uniform1i(1, 1 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

			// Pass input sampler/image to shader
			if (f.name != "sparseImageLoadARB")
			{
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");
				gl.uniform1i(2, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			}
			else
			{
				gl.bindImageTexture(0, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(2, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			}

			// Pass committed region width to shader
			gl.uniform1i(3, widthCommitted /* committed region width */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.dispatchCompute(width, height, depth);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
			gl.memoryBarrier(GL_ALL_BARRIER_BITS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint z = 0; z < depth; ++z)
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width + z * width * height;
						GLubyte* outDataRegion = out_data + x + y * width + z * width * height;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
		}
		else
		{
			mLog << "Compute shader compilation failed (lookup) for target: " << target << ", format: " << format
				 << ", shaderInfoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
				 << ", programInfoLog: " << program.getProgramInfo().infoLog << ", shaderSource: " << shader.c_str()
				 << " - ";

			result = false;
		}
	}

	Texture::Delete(gl, verifyTexture);

	return result;
}